

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

void GetCombinedEntropyUnrefined_C
               (uint32_t *X,uint32_t *Y,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint32_t uVar9;
  bool bVar10;
  float fVar11;
  
  uVar6 = *Y + *X;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0.0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffffffff;
  if (length < 2) {
    uVar8 = 1;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    uVar8 = 1;
    do {
      uVar2 = Y[uVar8];
      uVar3 = X[uVar8];
      if (uVar2 + uVar3 != uVar6) {
        uVar5 = (uint32_t)uVar8;
        iVar7 = uVar5 - uVar9;
        if (uVar6 != 0) {
          bit_entropy->sum = bit_entropy->sum + iVar7 * uVar6;
          bit_entropy->nonzeros = (bit_entropy->nonzeros - uVar9) + uVar5;
          bit_entropy->nonzero_code = uVar9;
          if (uVar6 < 0x100) {
            fVar11 = kSLog2Table[uVar6];
          }
          else {
            fVar11 = (*VP8LFastSLog2Slow)(uVar6);
          }
          bit_entropy->entropy = bit_entropy->entropy - (double)((float)iVar7 * fVar11);
          if (bit_entropy->max_val < uVar6) {
            bit_entropy->max_val = uVar6;
          }
        }
        bVar4 = 3 < iVar7;
        bVar10 = uVar6 != 0;
        stats->counts[bVar10] = stats->counts[bVar10] + (uint)bVar4;
        stats->streaks[bVar10][bVar4] = (stats->streaks[bVar10][bVar4] - uVar9) + uVar5;
        uVar6 = uVar2 + uVar3;
        uVar9 = uVar5;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)length != uVar8);
  }
  iVar7 = (int)uVar8 - uVar9;
  if (uVar6 != 0) {
    bit_entropy->sum = bit_entropy->sum + iVar7 * uVar6;
    bit_entropy->nonzeros = bit_entropy->nonzeros + iVar7;
    bit_entropy->nonzero_code = uVar9;
    if (uVar6 < 0x100) {
      fVar11 = kSLog2Table[uVar6];
    }
    else {
      fVar11 = (*VP8LFastSLog2Slow)(uVar6);
    }
    bit_entropy->entropy = bit_entropy->entropy - (double)((float)iVar7 * fVar11);
    if (bit_entropy->max_val < uVar6) {
      bit_entropy->max_val = uVar6;
    }
  }
  stats->counts[uVar6 != 0] = stats->counts[uVar6 != 0] + (uint)(3 < iVar7);
  piVar1 = stats->streaks[uVar6 != 0] + (3 < iVar7);
  *piVar1 = *piVar1 + iVar7;
  uVar6 = bit_entropy->sum;
  if ((ulong)uVar6 < 0x100) {
    fVar11 = kSLog2Table[uVar6];
  }
  else {
    fVar11 = (*VP8LFastSLog2Slow)(uVar6);
  }
  bit_entropy->entropy = (double)fVar11 + bit_entropy->entropy;
  return;
}

Assistant:

static void GetCombinedEntropyUnrefined_C(const uint32_t X[],
                                          const uint32_t Y[],
                                          int length,
                                          VP8LBitEntropy* const bit_entropy,
                                          VP8LStreaks* const stats) {
  int i = 1;
  int i_prev = 0;
  uint32_t xy_prev = X[0] + Y[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t xy = X[i] + Y[i];
    if (xy != xy_prev) {
      GetEntropyUnrefinedHelper(xy, i, &xy_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &xy_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy += VP8LFastSLog2(bit_entropy->sum);
}